

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbbt.c
# Opt level: O2

unsigned_long clipping_Xbitblt(DspInterface dsp,DLword *dummy,int x,int y,int w,int h)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  GC p_Var4;
  unsigned_long uVar5;
  int iVar6;
  Window WVar7;
  int iVar8;
  Display *pDVar9;
  undefined4 in_register_00000084;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_register_0000008c;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  
  uVar12 = CONCAT44(in_register_0000008c,h);
  uVar10 = CONCAT44(in_register_00000084,w);
  uVar11 = CONCAT44(in_register_00000014,x);
  uVar13 = CONCAT44(in_register_0000000c,y);
  uVar1 = (dsp->Visible).x;
  uVar2 = (dsp->Visible).y;
  iVar15 = (dsp->Visible).width + uVar1;
  iVar6 = (dsp->Visible).height + uVar2;
  iVar8 = w + x;
  iVar3 = h + y;
  if (y < iVar6 && (((int)uVar2 < iVar3 && (int)uVar1 < iVar8) && x < iVar15)) {
    iVar17 = x - uVar1;
    iVar14 = y - uVar2;
    uVar5 = 1;
    if (iVar6 < iVar3 || ((y < (int)uVar2 || x < (int)uVar1) || iVar15 < iVar8)) {
      iVar17 = x - uVar1;
      if ((int)uVar1 <= x) {
        iVar17 = 0;
      }
      iVar14 = iVar15 - iVar8;
      if (iVar8 <= iVar15) {
        iVar14 = 0;
      }
      uVar16 = iVar14 + iVar17 + w;
      uVar10 = (ulong)uVar16;
      iVar8 = y - uVar2;
      if ((int)uVar2 <= y) {
        iVar8 = 0;
      }
      iVar15 = iVar6 - iVar3;
      if (iVar3 <= iVar6) {
        iVar15 = 0;
      }
      if ((int)uVar16 < 1) {
        return 1;
      }
      uVar16 = iVar8 + h + iVar15;
      uVar12 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        return 1;
      }
      uVar13 = (ulong)(uint)y;
      if (y < (int)uVar2) {
        uVar13 = (ulong)uVar2;
      }
      uVar11 = (ulong)(uint)x;
      if (x < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      pDVar9 = dsp->display_id;
      WVar7 = dsp->DisplayWindow;
      p_Var4 = dsp->Copy_GC;
      iVar17 = (int)uVar11 - uVar1;
      iVar14 = (int)uVar13 - uVar2;
    }
    else {
      pDVar9 = dsp->display_id;
      WVar7 = dsp->DisplayWindow;
      p_Var4 = dsp->Copy_GC;
    }
    XPutImage(pDVar9,WVar7,p_Var4,&dsp->ScreenBitmap,uVar11,uVar13,iVar17,iVar14,uVar10,uVar12);
    XFlush(dsp->display_id);
  }
  else {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

unsigned long clipping_Xbitblt(DspInterface dsp, DLword *dummy, int x, int y, int w, int h)
{
  int temp_x, temp_y, LowerRightX, LowerRightY;

  LowerRightX = dsp->Visible.x + (int)dsp->Visible.width - 1;
  LowerRightY = dsp->Visible.y + (int)dsp->Visible.height - 1;

  /* display region of interest lower right x, y pixel */
  temp_x = x + w - 1;
  temp_y = y + h - 1;

  /* if the display region of interest is completely outside the visible window */
  if ((temp_x < dsp->Visible.x) || (x > LowerRightX) || (temp_y < dsp->Visible.y) ||
      (y > LowerRightY))
    return (0);

  /* if the display region of interest is completely within the visible window */
  if ((x >= dsp->Visible.x) && (temp_x <= LowerRightX) && (y >= dsp->Visible.y) &&
      (temp_y <= LowerRightY)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
    return (1);
  }

  /* clip left to visible window */
  if (x < dsp->Visible.x) {
    w -= dsp->Visible.x - x;
    x = dsp->Visible.x;
  }

  /* clip right to visible window */
  if (temp_x > LowerRightX) w -= temp_x - LowerRightX;

  /* clip top to visible window */
  if (y < dsp->Visible.y) {
    h -= dsp->Visible.y - y;
    y = dsp->Visible.y;
  }

  /* clip bottom to visible window */
  if (temp_y > LowerRightY) h -= temp_y - LowerRightY;

  if ((w > 0) && (h > 0)) {
    XLOCK;
    XPutImage(dsp->display_id, dsp->DisplayWindow, dsp->Copy_GC, &dsp->ScreenBitmap, x, y,
              x - dsp->Visible.x, y - dsp->Visible.y, (unsigned)w, (unsigned)h);
    XFlush(dsp->display_id);
    XUNLOCK(dsp);
  }
  return (1);

}